

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall FInterpolator::DoInterpolations(FInterpolator *this,double smoothratio)

{
  DInterpolation *pDVar1;
  DInterpolation *pDVar2;
  
  if (1.0 <= smoothratio) {
    this->didInterp = false;
  }
  else {
    this->didInterp = true;
    pDVar2 = (this->Head).field_0.p;
    if ((pDVar2 != (DInterpolation *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
      (this->Head).field_0.p = (DInterpolation *)0x0;
      pDVar2 = (DInterpolation *)0x0;
    }
    while (pDVar2 != (DInterpolation *)0x0) {
      pDVar1 = (pDVar2->Next).field_0.p;
      if ((pDVar1 != (DInterpolation *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0))
      {
        (pDVar2->Next).field_0.p = (DInterpolation *)0x0;
        pDVar1 = (DInterpolation *)0x0;
      }
      (*(pDVar2->super_DObject)._vptr_DObject[9])(smoothratio);
      pDVar2 = pDVar1;
    }
  }
  return;
}

Assistant:

void FInterpolator::DoInterpolations(double smoothratio)
{
	if (smoothratio >= 1.)
	{
		didInterp = false;
		return;
	}

	didInterp = true;

	DInterpolation *probe = Head;
	while (probe != NULL)
	{
		DInterpolation *next = probe->Next;
		probe->Interpolate(smoothratio);
		probe = next;
	}
}